

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilsTests.cpp
# Opt level: O2

int testSpecDowngradePipeline(void)

{
  PipelineClassifier *pPVar1;
  Pipeline *pPVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ImageFeatureType *pIVar6;
  Model *pMVar7;
  ArrayFeatureType *pAVar8;
  VisionFeaturePrint *this;
  VisionFeaturePrint_Scene *pVVar9;
  GLMClassifier *this_00;
  GLMClassifier_DoubleArray *this_01;
  StringVector *pSVar10;
  Type *pTVar11;
  ostream *poVar12;
  int iVar13;
  char *pcVar14;
  bool bVar15;
  Model model;
  Model spec;
  
  CoreML::Specification::Model::Model(&spec);
  spec.specificationversion_ = 5;
  pPVar1 = CoreML::Specification::Model::mutable_pipelineclassifier(&spec);
  pPVar2 = CoreML::Specification::PipelineClassifier::mutable_pipeline(pPVar1);
  pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"image");
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pIVar6 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar5);
  pIVar6->width_ = 299;
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pIVar6 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar5);
  pIVar6->height_ = 299;
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pIVar6 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar5);
  pIVar6->colorspace_ = 0x1e;
  pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"classLabel");
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar5);
  pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
  CoreML::Specification::ModelDescription::set_predictedfeaturename(pMVar3,"classLabel");
  pMVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(&pPVar2->models_);
  pMVar7->specificationversion_ = 5;
  pMVar3 = CoreML::Specification::Model::mutable_description(pMVar7);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"image");
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pIVar6 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar5);
  pIVar6->width_ = 299;
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pIVar6 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar5);
  pIVar6->height_ = 299;
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pIVar6 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar5);
  pIVar6->colorspace_ = 0x1e;
  pMVar3 = CoreML::Specification::Model::mutable_description(pMVar7);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"features");
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pAVar8 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  pAVar8->datatype_ = 0x10020;
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pAVar8 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar8,0x800);
  this = CoreML::Specification::Model::mutable_visionfeatureprint(pMVar7);
  pVVar9 = CoreML::Specification::CoreMLModels::VisionFeaturePrint::mutable_scene(this);
  pVVar9->version_ = 1;
  pMVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(&pPVar2->models_);
  pMVar7->specificationversion_ = 5;
  pMVar3 = CoreML::Specification::Model::mutable_description(pMVar7);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"features");
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pAVar8 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  pAVar8->datatype_ = 0x10020;
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pAVar8 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar8,0x800);
  pMVar3 = CoreML::Specification::Model::mutable_description(pMVar7);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"classLabel");
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar5);
  pMVar3 = CoreML::Specification::Model::mutable_description(pMVar7);
  CoreML::Specification::ModelDescription::set_predictedfeaturename(pMVar3,"classLabel");
  this_00 = CoreML::Specification::Model::mutable_glmclassifier(pMVar7);
  this_00->postevaluationtransform_ = 0;
  CoreML::Specification::GLMClassifier::add_offset(this_00,0.0);
  this_01 = google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
            Add(&this_00->weights_);
  iVar13 = 0x800;
  while (bVar15 = iVar13 != 0, iVar13 = iVar13 + -1, bVar15) {
    CoreML::Specification::GLMClassifier_DoubleArray::add_value(this_01,0.0);
  }
  pSVar10 = CoreML::Specification::GLMClassifier::mutable_stringclasslabels(this_00);
  CoreML::Specification::StringVector::add_vector(pSVar10,"cat");
  pSVar10 = CoreML::Specification::GLMClassifier::mutable_stringclasslabels(this_00);
  CoreML::Specification::StringVector::add_vector(pSVar10,"dog");
  CoreML::Model::Model(&model,&spec);
  pMVar7 = CoreML::Model::getProto(&model);
  if (pMVar7->specificationversion_ == 3) {
    pMVar7 = CoreML::Model::getProto(&model);
    pPVar1 = CoreML::Specification::Model::pipelineclassifier(pMVar7);
    pPVar2 = pPVar1->pipeline_;
    if (pPVar2 == (Pipeline *)0x0) {
      pPVar2 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
    }
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                        (&(pPVar2->models_).super_RepeatedPtrFieldBase,0);
    if (pTVar11->specificationversion_ == 3) {
      pMVar7 = CoreML::Model::getProto(&model);
      pPVar1 = CoreML::Specification::Model::pipelineclassifier(pMVar7);
      pPVar2 = pPVar1->pipeline_;
      if (pPVar2 == (Pipeline *)0x0) {
        pPVar2 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
      }
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                          (&(pPVar2->models_).super_RepeatedPtrFieldBase,1);
      iVar13 = 0;
      if (pTVar11->specificationversion_ == 1) goto LAB_0016988e;
      poVar12 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UtilsTests.cpp"
                               );
      poVar12 = std::operator<<(poVar12,":");
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0x4f);
      poVar12 = std::operator<<(poVar12,": error: ");
      pcVar14 = 
      "(model.getProto().pipelineclassifier().pipeline().models(1).specificationversion()) == (MLMODEL_SPECIFICATION_VERSION_IOS11)"
      ;
    }
    else {
      poVar12 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UtilsTests.cpp"
                               );
      poVar12 = std::operator<<(poVar12,":");
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0x4c);
      poVar12 = std::operator<<(poVar12,": error: ");
      pcVar14 = 
      "(model.getProto().pipelineclassifier().pipeline().models(0).specificationversion()) == (MLMODEL_SPECIFICATION_VERSION_IOS12)"
      ;
    }
  }
  else {
    poVar12 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UtilsTests.cpp"
                             );
    poVar12 = std::operator<<(poVar12,":");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0x49);
    poVar12 = std::operator<<(poVar12,": error: ");
    pcVar14 = "(model.getProto().specificationversion()) == (MLMODEL_SPECIFICATION_VERSION_IOS12)";
  }
  poVar12 = std::operator<<(poVar12,pcVar14);
  poVar12 = std::operator<<(poVar12," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar12);
  iVar13 = 1;
LAB_0016988e:
  CoreML::Model::~Model(&model);
  CoreML::Specification::Model::~Model(&spec);
  return iVar13;
}

Assistant:

int testSpecDowngradePipeline() {

    int32_t latestVersion = MLMODEL_SPECIFICATION_VERSION;

    Specification::Model spec;
    spec.set_specificationversion(latestVersion);
    auto* pipeline = spec.mutable_pipelineclassifier()->mutable_pipeline();

    auto* input = spec.mutable_description()->add_input();
    input->set_name("image");
    input->mutable_type()->mutable_imagetype()->set_width(299);
    input->mutable_type()->mutable_imagetype()->set_height(299);
    input->mutable_type()->mutable_imagetype()->set_colorspace(Specification::ImageFeatureType_ColorSpace_BGR);

    auto* output = spec.mutable_description()->add_output();
    output->set_name("classLabel");
    output->mutable_type()->mutable_stringtype();

    spec.mutable_description()->set_predictedfeaturename("classLabel");

    // VisionFeaturePrint
    auto *featureModel = pipeline->add_models();
    featureModel->set_specificationversion(latestVersion);

    auto* featureInput = featureModel->mutable_description()->add_input();
    featureInput->set_name("image");
    featureInput->mutable_type()->mutable_imagetype()->set_width(299);
    featureInput->mutable_type()->mutable_imagetype()->set_height(299);
    featureInput->mutable_type()->mutable_imagetype()->set_colorspace(Specification::ImageFeatureType_ColorSpace_BGR);

    auto featureOutput = featureModel->mutable_description()->add_output();
    featureOutput->set_name("features");
    featureOutput->mutable_type()->mutable_multiarraytype()->set_datatype(Specification::ArrayFeatureType::FLOAT32);
    featureOutput->mutable_type()->mutable_multiarraytype()->add_shape(2048);


    featureModel->mutable_visionfeatureprint()->mutable_scene()->set_version(Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1);

    // Logistic regression
    auto *classifierModel = pipeline->add_models();
    classifierModel->set_specificationversion(latestVersion);

    auto classifierInput = classifierModel->mutable_description()->add_input();
    classifierInput->set_name("features");
    classifierInput->mutable_type()->mutable_multiarraytype()->set_datatype(Specification::ArrayFeatureType::FLOAT32);
    classifierInput->mutable_type()->mutable_multiarraytype()->add_shape(2048);

    auto classifierOutput = classifierModel->mutable_description()->add_output();
    classifierOutput->set_name("classLabel");
    classifierOutput->mutable_type()->mutable_stringtype();
    classifierModel->mutable_description()->set_predictedfeaturename("classLabel");

    auto glm = classifierModel->mutable_glmclassifier();
    glm->set_postevaluationtransform(::CoreML::Specification::GLMClassifier_PostEvaluationTransform_Logit);
    glm->add_offset(0.0);
    auto weights = glm->add_weights();
    for (int i=0; i<2048; i++) { weights->add_value(0.0); }
    glm->mutable_stringclasslabels()->add_vector("cat");
    glm->mutable_stringclasslabels()->add_vector("dog");

    // Constructing an CoreML::Model should downgrade spec on load
    Model model(spec);

    // Top level should be IOS 12 because it contains vision feature print
    ML_ASSERT_EQ(model.getProto().specificationversion(), MLMODEL_SPECIFICATION_VERSION_IOS12);

    // First model in pipeline is vision feature print and should have IOS12 spec version
    ML_ASSERT_EQ(model.getProto().pipelineclassifier().pipeline().models(0).specificationversion(), MLMODEL_SPECIFICATION_VERSION_IOS12);

    // Second model is just a GLM which has support in IOS 11
    ML_ASSERT_EQ(model.getProto().pipelineclassifier().pipeline().models(1).specificationversion(), MLMODEL_SPECIFICATION_VERSION_IOS11);

    return 0;
}